

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_StEnvSlotChkUndecl
          (InterpreterStackFrame *this,Var instance,int32 slotIndex1,int32 slotIndex2,Var value)

{
  Var instance_00;
  
  instance_00 = OP_LdFrameDisplaySlot(this,instance,slotIndex1);
  OP_StSlotChkUndecl(this,instance_00,slotIndex2,value);
  return;
}

Assistant:

void InterpreterStackFrame::OP_StEnvSlotChkUndecl(Var instance, int32 slotIndex1, int32 slotIndex2, Var value)
    {
        Var slotArray = OP_LdFrameDisplaySlot(instance, slotIndex1);
        OP_StSlotChkUndecl(slotArray, slotIndex2, value);
    }